

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileHasSignature(char *filename,char *signature,long offset)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  char *__s1;
  size_t sVar2;
  bool bVar3;
  char *buffer;
  size_t signature_len;
  bool res;
  allocator local_51;
  string local_50;
  FILE *local_30;
  FILE *fp;
  long offset_local;
  char *signature_local;
  char *filename_local;
  
  if ((filename == (char *)0x0) || (signature == (char *)0x0)) {
    filename_local._7_1_ = false;
  }
  else {
    fp = (FILE *)offset;
    offset_local = (long)signature;
    signature_local = filename;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,filename,&local_51);
    __stream = (FILE *)Fopen(&local_50,"rb");
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (__stream == (FILE *)0x0) {
      filename_local._7_1_ = false;
    }
    else {
      local_30 = __stream;
      fseek(__stream,(long)fp,0);
      bVar3 = false;
      __n = strlen((char *)offset_local);
      __s1 = (char *)operator_new__(__n);
      sVar2 = fread(__s1,1,__n,local_30);
      if (sVar2 == __n) {
        iVar1 = strncmp(__s1,(char *)offset_local,__n);
        bVar3 = iVar1 == 0;
      }
      if (__s1 != (char *)0x0) {
        operator_delete__(__s1);
      }
      fclose(local_30);
      filename_local._7_1_ = bVar3;
    }
  }
  return filename_local._7_1_;
}

Assistant:

bool SystemTools::FileHasSignature(const char *filename,
                                   const char *signature,
                                   long offset)
{
  if (!filename || !signature)
    {
    return false;
    }

  FILE *fp = Fopen(filename, "rb");
  if (!fp)
    {
    return false;
    }

  fseek(fp, offset, SEEK_SET);

  bool res = false;
  size_t signature_len = strlen(signature);
  char *buffer = new char [signature_len];

  if (fread(buffer, 1, signature_len, fp) == signature_len)
    {
    res = (!strncmp(buffer, signature, signature_len) ? true : false);
    }

  delete [] buffer;

  fclose(fp);
  return res;
}